

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_paramhlp.c
# Opt level: O3

getout * new_getout(OperationConfig *config)

{
  getout *pgVar1;
  getout *pgVar2;
  
  pgVar1 = (getout *)calloc(1,0x28);
  if (pgVar1 != (getout *)0x0) {
    pgVar2 = (getout *)&config->url_list;
    if (config->url_last != (getout *)0x0) {
      pgVar2 = config->url_last;
    }
    pgVar2->next = pgVar1;
    config->url_last = pgVar1;
    pgVar1->flags = config->default_node_flags;
  }
  return pgVar1;
}

Assistant:

struct getout *new_getout(struct OperationConfig *config)
{
  struct getout *node = calloc(1, sizeof(struct getout));
  struct getout *last = config->url_last;
  if(node) {
    /* append this new node last in the list */
    if(last)
      last->next = node;
    else
      config->url_list = node; /* first node */

    /* move the last pointer */
    config->url_last = node;

    node->flags = config->default_node_flags;
  }
  return node;
}